

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperCardPro.cpp
# Opt level: O2

bool __thiscall SuperCardPro::WriteExact(SuperCardPro *this,void *buf,int len)

{
  uint in_EAX;
  int iVar1;
  int bytes_written;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  for (; 0 < len; len = len - uStack_28._4_4_) {
    iVar1 = (*this->_vptr_SuperCardPro[3])(this,buf,(ulong)(uint)len,(long)&uStack_28 + 4);
    if ((char)iVar1 == '\0') goto LAB_00176871;
    buf = (void *)((long)buf + (long)uStack_28._4_4_);
  }
  usleep(5000);
LAB_00176871:
  return len < 1;
}

Assistant:

bool SuperCardPro::WriteExact(const void* buf, int len)
{
    auto p = reinterpret_cast<const uint8_t*>(buf);
    auto bytes_written = 0;

    while (len > 0)
    {
        if (!Write(p, len, &bytes_written))
            return false;

        len -= bytes_written;
        p += bytes_written;
    }

#ifndef _WIN32
    // ToDo: find why the Raspberry Pi needs this.
    usleep(5000);
#endif

    return true;
}